

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O2

void __thiscall SolverTest_GetIntOption_Test::TestBody(SolverTest_GetIntOption_Test *this)

{
  SolverOptionManager *this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_3a8;
  AssertHelper local_3a0;
  AssertionResult gtest_ar;
  string local_388;
  TestSolverWithOptions test_solver;
  
  TestSolverWithOptions::TestSolverWithOptions(&test_solver);
  local_3a0.data_._0_4_ = 0;
  this_00 = &test_solver.super_Solver.super_BasicSolver.super_SolverOptionManager;
  local_3a8.data_ = (AssertHelperData *)mp::SolverOptionManager::GetIntOption(this_00,"intopt1");
  testing::internal::CmpHelperEQ<int,long_long>
            ((internal *)&gtest_ar,"0","s.GetIntOption(\"intopt1\")",(int *)&local_3a0,
             (longlong *)&local_3a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x392,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_3a0.data_._0_4_ = 0x2a;
  test_solver.intopt1 = (int)local_3a0.data_;
  local_3a8.data_ = (AssertHelperData *)mp::SolverOptionManager::GetIntOption(this_00,"intopt1");
  testing::internal::CmpHelperEQ<int,long_long>
            ((internal *)&gtest_ar,"42","s.GetIntOption(\"intopt1\")",(int *)&local_3a0,
             (longlong *)&local_3a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",
               0x394,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::SolverOptionManager::GetDblOption(this_00,"intopt1");
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (&local_3a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",0x395
             ,
             "Expected: s.GetDblOption(\"intopt1\") throws an exception of type OptionError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_3a8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::SolverOptionManager::GetStrOption_abi_cxx11_(&local_388,this_00,"intopt1");
    std::__cxx11::string::~string((string *)&local_388);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (&local_3a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",0x396
             ,
             "Expected: s.GetStrOption(\"intopt1\") throws an exception of type OptionError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_3a8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::SolverOptionManager::GetIntOption(this_00,"badopt");
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (&local_3a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/solver-test.cc",0x397
             ,
             "Expected: s.GetIntOption(\"badopt\") throws an exception of type OptionError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_3a8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  TestSolverWithOptions::~TestSolverWithOptions(&test_solver);
  return;
}

Assistant:

TEST(SolverTest, GetIntOption) {
  TestSolverWithOptions test_solver;
  Solver &s = test_solver;
  EXPECT_EQ(0, s.GetIntOption("intopt1"));
  test_solver.intopt1 = 42;
  EXPECT_EQ(42, s.GetIntOption("intopt1"));
  EXPECT_THROW(s.GetDblOption("intopt1"), OptionError);
  EXPECT_THROW(s.GetStrOption("intopt1"), OptionError);
  EXPECT_THROW(s.GetIntOption("badopt"), OptionError);
}